

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::CheckBinaryOperator(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  bool local_39;
  bool local_25;
  const_iterator cStack_20;
  SymbolType type;
  Parser *local_18;
  Parser *this_local;
  
  local_25 = true;
  local_18 = this;
  if ((this->m_error & 1U) == 0) {
    cStack_20 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    local_25 = __gnu_cxx::operator==(&this->m_currentSymbol,&stack0xffffffffffffffe0);
  }
  if (local_25 == false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    SVar1 = pSVar2->type;
    local_39 = true;
    if (((((SVar1 != And) && (local_39 = true, SVar1 != Asterisk)) &&
         (local_39 = true, SVar1 != Equals)) &&
        ((((local_39 = true, SVar1 != NotEquals && (local_39 = true, SVar1 != ForwardSlash)) &&
          ((local_39 = true, SVar1 != GreaterThan &&
           ((local_39 = true, SVar1 != GreaterThanEquals && (local_39 = true, SVar1 != LessThan)))))
          ) && (local_39 = true, SVar1 != LessThanEquals)))) &&
       (((local_39 = true, SVar1 != Minus && (local_39 = true, SVar1 != Or)) &&
        (local_39 = true, SVar1 != Percent)))) {
      local_39 = SVar1 == Plus;
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool Parser::CheckBinaryOperator() const
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return false;
		auto type = m_currentSymbol->type;
		return
			type == SymbolType::And ||
			type == SymbolType::Asterisk ||
			type == SymbolType::Equals ||
			type == SymbolType::NotEquals ||
			type == SymbolType::ForwardSlash ||
			type == SymbolType::GreaterThan ||
			type == SymbolType::GreaterThanEquals ||
			type == SymbolType::LessThan ||
			type == SymbolType::LessThanEquals ||
			type == SymbolType::Minus ||
			type == SymbolType::Or ||
			type == SymbolType::Percent ||
			type == SymbolType::Plus;
	}